

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::Extension::
InternalSerializeMessageSetItemWithCachedSizesToArray
          (Extension *this,MessageLite *extendee,ExtensionSet *extension_set,int number,
          uint8_t *target,EpsCopyOutputStream *stream)

{
  anon_union_8_9_fdc4a54a_for_Extension_0 this_00;
  bool bVar1;
  uint uVar2;
  int cached_size;
  uint8_t *ptr;
  uint uVar3;
  byte *pbVar4;
  undefined8 uVar5;
  bool was_packed_on_wire;
  ExtensionInfo extension_info;
  GeneratedExtensionFinder finder;
  bool local_69;
  ExtensionInfo local_68;
  GeneratedExtensionFinder local_38;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 2) == 0) {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      target[0] = '\v';
      target[1] = '\x10';
      pbVar4 = target + 2;
      uVar2 = number;
      uVar3 = number;
      if (0x7f < (uint)number) {
        do {
          *pbVar4 = (byte)uVar3 | 0x80;
          pbVar4 = pbVar4 + 1;
          bVar1 = 0x3fff < uVar3;
          uVar2 = uVar3 >> 7;
          uVar3 = uVar3 >> 7;
        } while (bVar1);
      }
      *pbVar4 = (byte)uVar2;
      if ((this->field_0xa & 4) == 0) {
        this_00 = this->field_0;
        cached_size = MessageLite::GetCachedSize(this_00);
        ptr = WireFormatLite::InternalWriteMessage
                        (3,(MessageLite *)this_00,cached_size,pbVar4 + 1,stream);
      }
      else {
        local_69 = false;
        local_68.descriptor = (FieldDescriptor *)0x0;
        local_68.lazy_eager_verify_func = (LazyEagerVerifyFnType)0x0;
        local_68.field_6.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
        local_68.field_6.enum_validity_check.arg = (void *)0x0;
        local_68.message = (MessageLite *)0x0;
        local_68.number = 0;
        local_68.type = '\0';
        local_68.is_repeated = false;
        local_68.is_packed = false;
        local_68.is_lazy = kUndefined;
        local_38.extendee_ = extendee;
        bVar1 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
                          (extension_set,2,number,&local_38,&local_68,&local_69);
        uVar5 = local_68.field_6.enum_validity_check.func;
        if (!bVar1) {
          uVar5 = (EnumValidityFuncWithArg *)0x0;
        }
        ptr = (uint8_t *)
              (**(code **)(**(long **)&(this->field_0).int32_t_value + 0x98))
                        (*(long **)&(this->field_0).int32_t_value,uVar5,3,pbVar4 + 1,stream);
      }
      if (stream->end_ <= ptr) {
        ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
      }
      *ptr = '\f';
      target = ptr + 1;
    }
  }
  else {
    absl::lts_20240722::log_internal::LogMessage::LogMessage
              ((LogMessage *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x78c);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (&local_68,0x1e,"Invalid message set extension.");
    absl::lts_20240722::log_internal::LogMessage::~LogMessage((LogMessage *)&local_68);
    target = InternalSerializeFieldWithCachedSizesToArray
                       (this,extendee,extension_set,number,target,stream);
  }
  return target;
}

Assistant:

uint8_t*
ExtensionSet::Extension::InternalSerializeMessageSetItemWithCachedSizesToArray(
    const MessageLite* extendee, const ExtensionSet* extension_set, int number,
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but serialize it the normal way.
    ABSL_LOG(WARNING) << "Invalid message set extension.";
    return InternalSerializeFieldWithCachedSizesToArray(extendee, extension_set,
                                                        number, target, stream);
  }

  if (is_cleared) return target;

  target = stream->EnsureSpace(target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, number, target);
  // Write message.
  if (is_lazy) {
    const auto* prototype =
        extension_set->GetPrototypeForLazyMessage(extendee, number);
    target = ptr.lazymessage_value->WriteMessageToArray(
        prototype, WireFormatLite::kMessageSetMessageNumber, target, stream);
  } else {
    target = WireFormatLite::InternalWriteMessage(
        WireFormatLite::kMessageSetMessageNumber, *ptr.message_value,
        ptr.message_value->GetCachedSize(), target, stream);
  }
  // End group.
  target = stream->EnsureSpace(target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}